

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.hpp
# Opt level: O3

int deqp::gles31::Functional::anon_unknown_3::getNumDataTypeVectors(DataType type)

{
  int iVar1;
  
  if (type - TYPE_FLOAT < 0x23) {
    if ((2 < type - TYPE_BOOL_VEC2 & ((byte)(0x7fc01e00f >> ((byte)(type - TYPE_FLOAT) & 0x3f)) ^ 1)
        ) == 0) {
      return 1;
    }
  }
  else if (type - TYPE_BOOL_VEC2 < 3) {
    return 1;
  }
  if (8 < type - TYPE_FLOAT_MAT2 && 8 < type - TYPE_DOUBLE_MAT2) {
    return 0;
  }
  iVar1 = glu::getDataTypeMatrixNumColumns(type);
  return iVar1;
}

Assistant:

inline bool		isDataTypeScalar			(DataType dataType) { return (dataType == TYPE_FLOAT) || (dataType == TYPE_DOUBLE) ||(dataType == TYPE_INT) || (dataType == TYPE_UINT) || (dataType == TYPE_BOOL); }